

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::SetIntegrationRule
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this,int int_order)

{
  TPZIntPoints *pTVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  TPZManVector<int,_3> ord;
  TPZManVector<int,_3> local_48;
  int local_14;
  
  local_14 = int_order;
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
  TPZManVector<int,_3>::TPZManVector(&local_48,(long)iVar2,&local_14);
  pTVar1 = (this->super_TPZMultiphysicsElement).super_TPZCompEl.fIntegrationRule;
  if (pTVar1 == (TPZIntPoints *)0x0) {
    TPZInt1d::SetOrder(&this->fIntRule,&local_48.super_TPZVec<int>,0);
  }
  else {
    (*pTVar1->_vptr_TPZIntPoints[5])(pTVar1,&local_48,0);
  }
  if (local_48.super_TPZVec<int>.fStore == local_48.fExtAlloc) {
    local_48.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_48.super_TPZVec<int>.fNAlloc = 0;
  local_48.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_48.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_48.super_TPZVec<int>.fStore);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::SetIntegrationRule(int int_order) {
    
#ifdef PZDEBUG
    if (!this->Reference()) {
        DebugStop();
    }
#endif
    int dim = this->Reference()->Dimension();
    TPZManVector<int,3> ord(dim,int_order);
    if (TPZCompEl::fIntegrationRule) {
        TPZCompEl::fIntegrationRule->SetOrder(ord);
    }else{
        fIntRule.SetOrder(ord);
    }
    
}